

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

int av1_is_integer_mv(YV12_BUFFER_CONFIG *cur_picture,YV12_BUFFER_CONFIG *last_picture,
                     ForceIntegerMVInfo *force_intpel_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  long lVar6;
  int iVar7;
  uint8_t *puVar8;
  long lVar9;
  ulong uVar10;
  int tmpY;
  uint uVar11;
  int tmpX;
  ulong uVar12;
  int x_start;
  int y_pos;
  int y_start;
  bool bVar13;
  double dVar14;
  int local_58;
  int local_54;
  int local_50;
  
  iVar1 = (cur_picture->field_0).field_0.y_width;
  iVar2 = (cur_picture->field_1).field_0.y_height;
  local_54 = 0;
  local_58 = 0;
  local_50 = 0;
  iVar4 = 0;
  while (y_start = iVar4, y_start + 8 <= iVar2) {
    x_start = 0;
    while (iVar7 = x_start + 8, iVar4 = y_start + 8, iVar7 <= iVar1) {
      iVar4 = (cur_picture->field_4).field_0.y_stride;
      iVar3 = (last_picture->field_4).field_0.y_stride;
      puVar5 = (cur_picture->field_5).buffers[0] + (iVar4 * y_start + x_start);
      puVar8 = (last_picture->field_5).buffers[0] + (iVar3 * y_start + x_start);
      if ((cur_picture->flags & 8) == 0) {
        bVar13 = true;
        for (uVar11 = 0; (bVar13 && (uVar11 < 8)); uVar11 = uVar11 + 1) {
          bVar13 = true;
          for (uVar12 = 0; (bVar13 && (uVar12 < 8)); uVar12 = uVar12 + 1) {
            bVar13 = puVar5[uVar12] == puVar8[uVar12];
          }
          puVar5 = puVar5 + iVar4;
          puVar8 = puVar8 + iVar3;
        }
      }
      else {
        lVar6 = (long)puVar5 * 2;
        lVar9 = (long)puVar8 * 2;
        bVar13 = true;
        for (uVar11 = 0; (bVar13 && (uVar11 < 8)); uVar11 = uVar11 + 1) {
          bVar13 = true;
          for (uVar12 = 0; (bVar13 && (uVar12 < 8)); uVar12 = uVar12 + 1) {
            bVar13 = *(short *)(lVar6 + uVar12 * 2) == *(short *)(lVar9 + uVar12 * 2);
          }
          lVar9 = lVar9 + (long)iVar3 * 2;
          lVar6 = lVar6 + (long)iVar4 * 2;
        }
      }
      local_50 = local_50 + 1;
      if (bVar13) {
        local_58 = local_58 + 1;
        x_start = iVar7;
      }
      else {
        iVar4 = av1_hash_is_horizontal_perfect(cur_picture,8,x_start,y_start);
        if ((iVar4 != 0) ||
           (iVar4 = av1_hash_is_vertical_perfect(cur_picture,8,x_start,y_start), x_start = iVar7,
           iVar4 != 0)) {
          local_54 = local_54 + 1;
          x_start = iVar7;
        }
      }
    }
  }
  dVar14 = (double)(local_54 + local_58) / (double)local_50;
  iVar1 = force_intpel_info->rate_index;
  force_intpel_info->cs_rate_array[iVar1] = dVar14;
  force_intpel_info->rate_index = (iVar1 + 1) % 0x20;
  uVar11 = force_intpel_info->rate_size + 1;
  if (0x1e < force_intpel_info->rate_size) {
    uVar11 = 0x20;
  }
  force_intpel_info->rate_size = uVar11;
  if (0.8 <= dVar14) {
    if (local_58 == local_50) {
      return 1;
    }
    uVar12 = 0;
    uVar10 = 0;
    if (0 < (int)uVar11) {
      uVar10 = (ulong)uVar11;
    }
    dVar14 = 0.0;
    for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      dVar14 = dVar14 + force_intpel_info->cs_rate_array[uVar12];
    }
    if (0.95 <= dVar14 / (double)(int)uVar11) {
      if (local_50 - (local_54 + local_58) < 0) {
        return 1;
      }
      return (uint)(1.01 < dVar14 / (double)(int)uVar11);
    }
  }
  return 0;
}

Assistant:

int av1_is_integer_mv(const YV12_BUFFER_CONFIG *cur_picture,
                      const YV12_BUFFER_CONFIG *last_picture,
                      ForceIntegerMVInfo *const force_intpel_info) {
  // check use hash ME
  int k;

  const int block_size = FORCE_INT_MV_DECISION_BLOCK_SIZE;
  const double threshold_current = 0.8;
  const double threshold_average = 0.95;
  const int max_history_size = 32;
  int T = 0;  // total block
  int C = 0;  // match with collocated block
  int S = 0;  // smooth region but not match with collocated block

  const int pic_width = cur_picture->y_width;
  const int pic_height = cur_picture->y_height;
  for (int i = 0; i + block_size <= pic_height; i += block_size) {
    for (int j = 0; j + block_size <= pic_width; j += block_size) {
      const int x_pos = j;
      const int y_pos = i;
      int match = 1;
      T++;

      // check whether collocated block match with current
      uint8_t *p_cur = cur_picture->y_buffer;
      uint8_t *p_ref = last_picture->y_buffer;
      int stride_cur = cur_picture->y_stride;
      int stride_ref = last_picture->y_stride;
      p_cur += (y_pos * stride_cur + x_pos);
      p_ref += (y_pos * stride_ref + x_pos);

      if (cur_picture->flags & YV12_FLAG_HIGHBITDEPTH) {
        uint16_t *p16_cur = CONVERT_TO_SHORTPTR(p_cur);
        uint16_t *p16_ref = CONVERT_TO_SHORTPTR(p_ref);
        for (int tmpY = 0; tmpY < block_size && match; tmpY++) {
          for (int tmpX = 0; tmpX < block_size && match; tmpX++) {
            if (p16_cur[tmpX] != p16_ref[tmpX]) {
              match = 0;
            }
          }
          p16_cur += stride_cur;
          p16_ref += stride_ref;
        }
      } else {
        for (int tmpY = 0; tmpY < block_size && match; tmpY++) {
          for (int tmpX = 0; tmpX < block_size && match; tmpX++) {
            if (p_cur[tmpX] != p_ref[tmpX]) {
              match = 0;
            }
          }
          p_cur += stride_cur;
          p_ref += stride_ref;
        }
      }

      if (match) {
        C++;
        continue;
      }

      if (av1_hash_is_horizontal_perfect(cur_picture, block_size, x_pos,
                                         y_pos) ||
          av1_hash_is_vertical_perfect(cur_picture, block_size, x_pos, y_pos)) {
        S++;
        continue;
      }
    }
  }

  assert(T > 0);
  double cs_rate = ((double)(C + S)) / ((double)(T));

  force_intpel_info->cs_rate_array[force_intpel_info->rate_index] = cs_rate;

  force_intpel_info->rate_index =
      (force_intpel_info->rate_index + 1) % max_history_size;
  force_intpel_info->rate_size++;
  force_intpel_info->rate_size =
      AOMMIN(force_intpel_info->rate_size, max_history_size);

  if (cs_rate < threshold_current) {
    return 0;
  }

  if (C == T) {
    return 1;
  }

  double cs_average = 0.0;

  for (k = 0; k < force_intpel_info->rate_size; k++) {
    cs_average += force_intpel_info->cs_rate_array[k];
  }
  cs_average /= force_intpel_info->rate_size;

  if (cs_average < threshold_average) {
    return 0;
  }

  if ((T - C - S) < 0) {
    return 1;
  }

  if (cs_average > 1.01) {
    return 1;
  }

  return 0;
}